

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
agge::pod_vector<agge::tests::(anonymous_namespace)::A>::pod_vector
          (pod_vector<agge::tests::(anonymous_namespace)::A> *this,count_t initial_size)

{
  count_t initial_size_local;
  pod_vector<agge::tests::(anonymous_namespace)::A> *this_local;
  
  this->_begin = (A *)0x0;
  this->_end = (A *)0x0;
  this->_limit = (A *)0x0;
  resize(this,initial_size);
  return;
}

Assistant:

inline pod_vector<T>::pod_vector(count_t initial_size)
		: _begin(0), _end(0), _limit(0)
	{	resize(initial_size);	}